

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm,
                       ZSTD_tableFillPurpose_e tfp)

{
  long *p_00;
  uint h;
  uint uVar1;
  U32 *hashTable;
  BYTE *pBVar2;
  char cVar3;
  U32 h_00;
  size_t hashAndTag;
  ulong uVar4;
  U32 index;
  ulong uVar5;
  long *plVar6;
  int iVar7;
  U32 p;
  U32 UVar8;
  long lVar9;
  int local_40;
  
  hashTable = ms->hashTable;
  h = (ms->cParams).hashLog;
  cVar3 = (char)h;
  if (tfp == ZSTD_tfp_forCDict) {
    if (dtlm != ZSTD_dtlm_full) {
      __assert_fail("dtlm == ZSTD_dtlm_full",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6fcf,
                    "void ZSTD_fillHashTableForCDict(ZSTD_matchState_t *, const void *const, ZSTD_dictTableLoadMethod_e)"
                   );
    }
    h_00 = h + 8;
    pBVar2 = (ms->window).base;
    UVar8 = ms->nextToUpdate + 1;
    iVar7 = (ms->cParams).minMatch - 5;
    plVar6 = (long *)(pBVar2 + ms->nextToUpdate);
    while ((long *)((long)plVar6 + 3U) < (long *)((long)end - 6U)) {
      if (0x20 < h_00) {
LAB_00199aa0:
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      switch(iVar7) {
      case 0:
        uVar5 = *plVar6 * -0x30e4432345000000;
        goto LAB_001998da;
      case 1:
        hashAndTag = ZSTD_hash6Ptr(plVar6,h_00);
        break;
      case 2:
        uVar5 = *plVar6 * -0x30e44323405a9d00;
LAB_001998da:
        hashAndTag = uVar5 >> (0x38U - cVar3 & 0x3f);
        break;
      case 3:
        hashAndTag = ZSTD_hash8Ptr(plVar6,h_00);
        break;
      default:
        hashAndTag = (size_t)((uint)((int)*plVar6 * -0x61c8864f) >> (0x18U - cVar3 & 0x1f));
      }
      local_40 = (int)pBVar2;
      ZSTD_writeTaggedIndex(hashTable,hashAndTag,(int)plVar6 - local_40);
      index = UVar8;
      for (lVar9 = 1; lVar9 != 3; lVar9 = lVar9 + 1) {
        p_00 = (long *)((long)plVar6 + lVar9);
        switch(iVar7) {
        case 0:
          uVar5 = *p_00 * -0x30e4432345000000;
          goto LAB_0019996f;
        case 1:
          uVar5 = ZSTD_hash6Ptr(p_00,h_00);
          break;
        case 2:
          uVar5 = *p_00 * -0x30e44323405a9d00;
LAB_0019996f:
          uVar5 = uVar5 >> (0x38U - cVar3 & 0x3f);
          break;
        case 3:
          uVar5 = ZSTD_hash8Ptr(p_00,h_00);
          break;
        default:
          uVar5 = (ulong)((uint)((int)*p_00 * -0x61c8864f) >> (0x18U - cVar3 & 0x1f));
        }
        if (hashTable[uVar5 >> 8] == 0) {
          ZSTD_writeTaggedIndex(hashTable,uVar5,index);
        }
        index = index + 1;
      }
      UVar8 = UVar8 + 3;
      plVar6 = (long *)((long)plVar6 + 3U);
    }
  }
  else {
    if (dtlm != ZSTD_dtlm_fast) {
      __assert_fail("dtlm == ZSTD_dtlm_fast",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6ff2,
                    "void ZSTD_fillHashTableForCCtx(ZSTD_matchState_t *, const void *const, ZSTD_dictTableLoadMethod_e)"
                   );
    }
    uVar1 = (ms->cParams).minMatch;
    uVar5 = (ulong)ms->nextToUpdate;
    plVar6 = (long *)((ms->window).base + uVar5);
    while ((long *)((long)plVar6 + 3) < (long *)((long)end - 6U)) {
      if (0x20 < h) goto LAB_00199aa0;
      switch(uVar1) {
      case 5:
        uVar4 = *plVar6 * -0x30e4432345000000;
        goto LAB_00199a61;
      case 6:
        uVar4 = ZSTD_hash6Ptr(plVar6,h);
        break;
      case 7:
        uVar4 = *plVar6 * -0x30e44323405a9d00;
LAB_00199a61:
        uVar4 = uVar4 >> (0x40U - cVar3 & 0x3f);
        break;
      case 8:
        uVar4 = ZSTD_hash8Ptr(plVar6,h);
        break;
      default:
        uVar4 = (ulong)((uint)((int)*plVar6 * -0x61c8864f) >> (0x20U - cVar3 & 0x1f));
      }
      hashTable[uVar4] = (U32)uVar5;
      uVar5 = (ulong)((U32)uVar5 + 3);
      plVar6 = (long *)((long)plVar6 + 3);
    }
  }
  return;
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm,
                        ZSTD_tableFillPurpose_e tfp)
{
    if (tfp == ZSTD_tfp_forCDict) {
        ZSTD_fillHashTableForCDict(ms, end, dtlm);
    } else {
        ZSTD_fillHashTableForCCtx(ms, end, dtlm);
    }
}